

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O2

CreatePegoutAddressResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::CreatePegoutAddressRequestStruct,cfd::js::api::CreatePegoutAddressResponseStruct>
          (CreatePegoutAddressResponseStruct *__return_storage_ptr__,api *this,
          CreatePegoutAddressRequestStruct *request,
          function<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CreatePegoutAddressResponseStruct local_110;
  
  CreatePegoutAddressResponseStruct::CreatePegoutAddressResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&)>
  ::operator()(&local_110,
               (function<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&)>
                *)request,(CreatePegoutAddressRequestStruct *)this);
  CreatePegoutAddressResponseStruct::operator=(__return_storage_ptr__,&local_110);
  CreatePegoutAddressResponseStruct::~CreatePegoutAddressResponseStruct(&local_110);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}